

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LipidTransVisitor.cpp
# Opt level: O3

void __thiscall
OpenMD::LipidTransVisitor::LipidTransVisitor
          (LipidTransVisitor *this,SimInfo *info,string *originSeleScript,string *refSeleScript)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  SelectionManager *this_02;
  int iVar1;
  StuntDouble *pSVar2;
  DirectionalAtom *pDVar3;
  long lVar4;
  int i;
  SelectionSet local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  SelectionManager *local_40;
  SelectionManager *local_38;
  
  local_48 = &(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p = (pointer)local_48;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__LipidTransVisitor_002bb1b0;
  this->info_ = info;
  this_00 = &this->originEvaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_40 = &this->originSeleMan_;
  SelectionManager::SelectionManager(local_40,info);
  this_01 = &this->refEvaluator_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  local_38 = &this->refSeleMan_;
  SelectionManager::SelectionManager(local_38,info);
  (this->origin_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->origin_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  this->refSd_ = (StuntDouble *)0x0;
  (this->rotMat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  (this->origin_).super_Vector<double,_3U>.data_[2] = 0.0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseVisitor).visitorName,0,
             (char *)(this->super_BaseVisitor).visitorName._M_string_length,0x264021);
  SelectionEvaluator::loadScriptString(this_00,originSeleScript);
  if ((this->originEvaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_60,this_00);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->originSeleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_60.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
    iVar1 = OpenMDBitSet::countBits
                      ((this->originSeleMan_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 == 1) {
      pSVar2 = SelectionManager::beginSelected(local_40,(int *)&local_60);
      if (pSVar2 == (StuntDouble *)0x0) {
        this->originDatom_ = (DirectionalAtom *)0x0;
      }
      else {
        pDVar3 = (DirectionalAtom *)
                 __dynamic_cast(pSVar2,&StuntDouble::typeinfo,&DirectionalAtom::typeinfo,0);
        this->originDatom_ = pDVar3;
        if (pDVar3 != (DirectionalAtom *)0x0) goto LAB_0021962f;
      }
      memcpy(&painCave,"LipidTransVisitor: origin selection must select an directional atom",0x44);
      painCave.isFatal = 1;
      simError();
    }
    else {
      memcpy(&painCave,"LipidTransVisitor: origin selection must select an directional atom",0x44);
      painCave.isFatal = 1;
      simError();
    }
  }
LAB_0021962f:
  SelectionEvaluator::loadScriptString(this_01,refSeleScript);
  if ((this->refEvaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_60,this_01);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->refSeleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_60.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
    this_02 = local_38;
    iVar1 = OpenMDBitSet::countBits
                      ((this->refSeleMan_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 == 1) {
      pSVar2 = SelectionManager::beginSelected(this_02,(int *)&local_60);
      this->refSd_ = pSVar2;
    }
  }
  return;
}

Assistant:

LipidTransVisitor::LipidTransVisitor(SimInfo* info,
                                       const std::string& originSeleScript,
                                       const std::string& refSeleScript) :
      BaseVisitor(),
      info_(info), originEvaluator_(info), originSeleMan_(info),
      refEvaluator_(info), refSeleMan_(info), refSd_(NULL) {
    visitorName = "LipidTransVisitor";

    originEvaluator_.loadScriptString(originSeleScript);
    if (!originEvaluator_.isDynamic()) {
      originSeleMan_.setSelectionSet(originEvaluator_.evaluate());
      if (originSeleMan_.getSelectionCount() == 1) {
        int i;
        originDatom_ =
            dynamic_cast<DirectionalAtom*>(originSeleMan_.beginSelected(i));
        if (originDatom_ == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "LipidTransVisitor: origin selection must select an "
                   "directional atom");
          painCave.isFatal = 1;
          simError();
        }
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LipidTransVisitor: origin selection must select an directional "
            "atom");
        painCave.isFatal = 1;
        simError();
      }
    }

    refEvaluator_.loadScriptString(refSeleScript);
    if (!refEvaluator_.isDynamic()) {
      refSeleMan_.setSelectionSet(refEvaluator_.evaluate());
      if (refSeleMan_.getSelectionCount() == 1) {
        int i;
        refSd_ = refSeleMan_.beginSelected(i);

      } else {
        // error
      }
    }
  }